

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,Surface *surface,
          qpImageCompressionMode compression)

{
  pointer pcVar1;
  void *data;
  TextureFormat local_38;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar1,pcVar1 + description->_M_string_length);
  local_38.order = RGBA;
  local_38.type = UNORM_INT8;
  data = (void *)(surface->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (surface->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&this->m_access,&local_38,surface->m_width,surface->m_height,1,data);
  *(undefined1 **)(this->m_scale).m_data = &DAT_3f8000003f800000;
  *(undefined1 **)((this->m_scale).m_data + 2) = &DAT_3f8000003f800000;
  (this->m_bias).m_data[0] = 0.0;
  (this->m_bias).m_data[1] = 0.0;
  (this->m_bias).m_data[2] = 0.0;
  (this->m_bias).m_data[3] = 0.0;
  this->m_compression = compression;
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const Surface& surface, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(surface.getAccess())
	, m_scale		(1.0f, 1.0f, 1.0f, 1.0f)
	, m_bias		(0.0f, 0.0f, 0.0f, 0.0f)
	, m_compression	(compression)
{
}